

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_reader_end(mz_zip_archive *pZip)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  mz_bool mVar3;
  mz_zip_internal_state *pState;
  
  mVar2 = 0;
  mVar3 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (pmVar1 = pZip->m_pState, mVar3 = mVar2, pmVar1 != (mz_zip_internal_state *)0x0)) &&
      (pZip->m_pAlloc != (mz_alloc_func)0x0)) &&
     ((pZip->m_pFree != (mz_free_func)0x0 && (mVar3 = 0, pZip->m_zip_mode == MZ_ZIP_MODE_READING))))
  {
    pZip->m_pState = (mz_zip_internal_state *)0x0;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_central_dir).m_p);
    (pmVar1->m_central_dir).m_capacity = 0;
    *(undefined8 *)&(pmVar1->m_central_dir).m_element_size = 0;
    (pmVar1->m_central_dir).m_p = (void *)0x0;
    (pmVar1->m_central_dir).m_size = 0;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_central_dir_offsets).m_p);
    (pmVar1->m_central_dir_offsets).m_capacity = 0;
    *(undefined8 *)&(pmVar1->m_central_dir_offsets).m_element_size = 0;
    (pmVar1->m_central_dir_offsets).m_p = (void *)0x0;
    (pmVar1->m_central_dir_offsets).m_size = 0;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_sorted_central_dir_offsets).m_p);
    (pmVar1->m_sorted_central_dir_offsets).m_capacity = 0;
    *(undefined8 *)&(pmVar1->m_sorted_central_dir_offsets).m_element_size = 0;
    (pmVar1->m_sorted_central_dir_offsets).m_p = (void *)0x0;
    (pmVar1->m_sorted_central_dir_offsets).m_size = 0;
    if ((FILE *)pmVar1->m_pFile != (FILE *)0x0) {
      fclose((FILE *)pmVar1->m_pFile);
      pmVar1->m_pFile = (FILE *)0x0;
    }
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar1);
    pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
    mVar3 = 1;
  }
  return mVar3;
}

Assistant:

mz_bool mz_zip_reader_end(mz_zip_archive *pZip)
{
  if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return MZ_FALSE;

  if (pZip->m_pState)
  {
    mz_zip_internal_state *pState = pZip->m_pState; pZip->m_pState = NULL;
    mz_zip_array_clear(pZip, &pState->m_central_dir);
    mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
    mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
    if (pState->m_pFile)
    {
      MZ_FCLOSE(pState->m_pFile);
      pState->m_pFile = NULL;
    }
#endif // #ifndef MINIZ_NO_STDIO

    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
  }
  pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;

  return MZ_TRUE;
}